

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

stbfile * stb_arith_encode_close(stb_arith *a)

{
  int iVar1;
  
  stb__arith_putbyte(a,(uint)*(byte *)((long)&a->range_low + 3));
  stb__arith_putbyte(a,(uint)*(ushort *)((long)&a->range_low + 2));
  stb__arith_putbyte(a,a->range_low >> 8);
  stb__arith_putbyte(a,a->range_low);
  if (-1 < a->pending_ffs) {
    (*a->output->putbyte)(a->output,a->buffered_u8);
    if (0 < a->pending_ffs) {
      iVar1 = 0;
      do {
        (*a->output->putbyte)(a->output,0xff);
        iVar1 = iVar1 + 1;
      } while (iVar1 < a->pending_ffs);
    }
  }
  return a->output;
}

Assistant:

stbfile *stb_arith_encode_close(stb_arith *a)
{
   // put exactly as many bytes as we'll read, so we can turn on/off arithmetic coding in a stream
   stb__arith_putbyte(a, a->range_low >> 24);
   stb__arith_putbyte(a, a->range_low >> 16);
   stb__arith_putbyte(a, a->range_low >>  8);
   stb__arith_putbyte(a, a->range_low >>  0);
   stb__arith_flush(a);
   return a->output;
}